

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O2

void __thiscall xmrig::Hashrate::Hashrate(Hashrate *this,size_t threads)

{
  uint64_t **ppuVar1;
  uint32_t *puVar2;
  uint64_t *puVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  
  this->m_threads = threads;
  uVar5 = -(ulong)(threads >> 0x3d != 0) | threads * 8;
  ppuVar1 = (uint64_t **)operator_new__(uVar5);
  this->m_counts = ppuVar1;
  ppuVar1 = (uint64_t **)operator_new__(uVar5);
  this->m_timestamps = ppuVar1;
  puVar2 = (uint32_t *)operator_new__(-(ulong)(threads >> 0x3e != 0) | threads * 4);
  this->m_top = puVar2;
  for (sVar4 = 0; threads != sVar4; sVar4 = sVar4 + 1) {
    puVar3 = (uint64_t *)operator_new__(0x8000);
    memset(puVar3,0,0x8000);
    this->m_counts[sVar4] = puVar3;
    puVar3 = (uint64_t *)operator_new__(0x8000);
    memset(puVar3,0,0x8000);
    this->m_timestamps[sVar4] = puVar3;
    this->m_top[sVar4] = 0;
  }
  return;
}

Assistant:

xmrig::Hashrate::Hashrate(size_t threads) :
    m_threads(threads)
{
    m_counts     = new uint64_t*[threads];
    m_timestamps = new uint64_t*[threads];
    m_top        = new uint32_t[threads];

    for (size_t i = 0; i < threads; i++) {
        m_counts[i]     = new uint64_t[kBucketSize]();
        m_timestamps[i] = new uint64_t[kBucketSize]();
        m_top[i]        = 0;
    }
}